

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O0

void __thiscall cppforth::Forth::readChar(Forth *this)

{
  byte bVar1;
  uint uVar2;
  element_type *peVar3;
  iostate status;
  uchar ch;
  allocator<char> local_49;
  string local_48 [32];
  undefined1 local_28 [8];
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  uint h;
  Forth *this_local;
  
  requireDStackDepth(this,1,"READ-CHAR");
  requireDStackAvailable(this,1,"READ-CHAR");
  uVar2 = ForthStack<unsigned_int>::getTop(&this->dStack);
  f.
  super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = uVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"READ-CHAR",&local_49);
  GetFileHandle((Forth *)local_28,(Cell)this,(string *)(ulong)uVar2,(errorCodes)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  peVar3 = std::
           __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
  std::ios::clear((int)peVar3 + (int)*(undefined8 *)(*(long *)peVar3 + -0x18));
  std::
  __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_28);
  uVar2 = std::istream::get();
  std::
  __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_28);
  std::ios::rdstate();
  ForthStack<unsigned_int>::setTop(&this->dStack,uVar2 & 0xff);
  std::
  __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_28);
  bVar1 = std::ios::bad();
  if ((bVar1 & 1) == 0) {
    push(this,0);
  }
  else {
    push(this,0xffffffba);
  }
  std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>::~shared_ptr
            ((shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> *)local_28);
  return;
}

Assistant:

void readChar() {
	REQUIRE_DSTACK_DEPTH(1, "READ-CHAR");
	REQUIRE_DSTACK_AVAILABLE(1, "READ-CHAR");
	auto h = (dStack.getTop());
	auto f = GetFileHandle(h, "READ-CHAR", errorReadFile);
	f->clear();
	auto ch = static_cast<unsigned char>(f->get());
	auto status = f->rdstate();
	dStack.setTop(static_cast<Cell>(ch));
	if (f->bad()) push(static_cast<Cell>(errorReadFile)); else push(0);
}